

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O2

void slang::uintToStrImpl<unsigned_long>
               (SmallVectorBase<char> *buffer,char *format,unsigned_long value)

{
  size_type index;
  int iVar1;
  reference __s;
  
  iVar1 = snprintf((char *)0x0,0,format,value);
  index = buffer->len;
  SmallVectorBase<char>::resize(buffer,(long)iVar1 + index + 1);
  __s = SmallVectorBase<char>::operator[](buffer,index);
  snprintf(__s,(long)iVar1 + 1,format,value);
  SmallVectorBase<char>::pop_back(buffer);
  return;
}

Assistant:

void uintToStrImpl(SmallVectorBase<char>& buffer, const char* format, T value) {
    size_t sz = (size_t)snprintf(nullptr, 0, format, value);
    size_t offset = buffer.size();
    buffer.resize(buffer.size() + sz + 1);

    snprintf(&buffer[offset], sz + 1, format, value);
    buffer.pop_back();
}